

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O1

PAL_ERROR __thiscall CorUnix::CPalThread::RunPostCreateInitializers(CPalThread *this)

{
  int iVar1;
  PAL_ERROR PVar2;
  
  iVar1 = pthread_setspecific(thObjKey,this);
  if (iVar1 != 0) {
    fprintf(_stderr,"] %s %s:%d","RunPostCreateInitializers",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x832);
    fprintf(_stderr,"Unable to set the thread object key\'s value\n");
    return 0x54f;
  }
  PVar2 = CThreadSynchronizationInfo::InitializePostCreate
                    (&this->synchronizationInfo,this,this->m_threadId,this->m_dwLwpId);
  return PVar2;
}

Assistant:

PAL_ERROR
CPalThread::RunPostCreateInitializers(
    void
    )
{
    PAL_ERROR palError = NO_ERROR;

    //
    // Call the post-create initializers for embedded classes
    //

    if (pthread_setspecific(thObjKey, reinterpret_cast<void*>(this)))
    {
        ASSERT("Unable to set the thread object key's value\n");
        palError = ERROR_INTERNAL_ERROR;
        goto RunPostCreateInitializersExit;
    }

    palError = synchronizationInfo.InitializePostCreate(this, m_threadId, m_dwLwpId);
    if (NO_ERROR != palError)
    {
        goto RunPostCreateInitializersExit;
    }

    palError = suspensionInfo.InitializePostCreate(this, m_threadId, m_dwLwpId);
    if (NO_ERROR != palError)
    {
        goto RunPostCreateInitializersExit;
    }

    palError = apcInfo.InitializePostCreate(this, m_threadId, m_dwLwpId);
    if (NO_ERROR != palError)
    {
        goto RunPostCreateInitializersExit;
    }

    palError = crtInfo.InitializePostCreate(this, m_threadId, m_dwLwpId);
    if (NO_ERROR != palError)
    {
        goto RunPostCreateInitializersExit;
    }

RunPostCreateInitializersExit:

    return palError;
}